

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

void __thiscall AllFloatsRoundtripTest::RunShard(AllFloatsRoundtripTest *this,int shard)

{
  bool bVar1;
  uint uVar2;
  LiteralType literal_type;
  size_t sVar3;
  char *pcVar4;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_b8;
  Message local_b0;
  Result local_a8;
  Enum local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  uint32_t new_bits;
  int len;
  int top_byte;
  int last_top_byte;
  uint32_t bits;
  uint32_t last_bits;
  char buffer [100];
  int shard_local;
  AllFloatsRoundtripTest *this_local;
  
  last_top_byte = 0;
  len = -1;
  top_byte = shard;
  buffer._92_4_ = shard;
  unique0x10000375 = this;
  while( true ) {
    if ((uint)top_byte < (uint)last_top_byte) {
      if (buffer._92_4_ == 0) {
        printf("done.\n");
        fflush(_stdout);
      }
      return;
    }
    if ((buffer._92_4_ == 0) && (uVar2 = (uint)top_byte >> 0x18, uVar2 != len)) {
      printf("value: 0x%08x (%d%%)\r",(ulong)(uint)top_byte,
             (ulong)(uint)(int)(((double)(uint)top_byte * 100.0) / 4294967295.0));
      fflush(_stdout);
      len = uVar2;
    }
    wabt::WriteFloatHex((char *)&bits,100,top_byte);
    sVar3 = strlen((char *)&bits);
    gtest_ar.message_.ptr_._4_4_ = (int)sVar3;
    local_a4 = Ok;
    literal_type = ClassifyFloat(top_byte);
    local_a8 = wabt::ParseFloat(literal_type,(char *)&bits,
                                (char *)((long)&bits + (long)gtest_ar.message_.ptr_._4_4_),
                                (uint32_t *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
              ((EqHelper<false> *)local_a0,"Result::Ok",
               "ParseFloat(ClassifyFloat(bits), buffer, buffer + len, &new_bits)",&local_a4,
               &local_a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                 ,0xa8,pcVar4);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::Message::~Message(&local_b0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_d0,"new_bits","bits",(uint *)&gtest_ar.message_,
               (uint *)&top_byte);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                 ,0xa9,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::Message::~Message(&local_d8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) {
      return;
    }
    last_top_byte = top_byte;
    top_byte = (this->super_ThreadedTest).num_threads_ + top_byte;
  }
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      WriteFloatHex(buffer, sizeof(buffer), bits);
      int len = strlen(buffer);

      uint32_t new_bits;
      ASSERT_EQ(Result::Ok, ParseFloat(ClassifyFloat(bits), buffer,
                                       buffer + len, &new_bits));
      ASSERT_EQ(new_bits, bits);
    }
    LOG_DONE();
  }